

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.cc
# Opt level: O0

vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
* cpsm::str_split(string_ref str,char delimiter)

{
  size_type sVar1;
  size_type in_RDX;
  vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  basic_string_ref<char,_std::char_traits<char>_> bVar2;
  basic_string_ref<char,_std::char_traits<char>_> *unaff_retaddr;
  size_type dpos;
  vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  *splits;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  *pos;
  
  pos = in_RDI;
  std::
  vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  ::vector((vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
            *)0x1b37d0);
  bVar2.len_ = in_stack_ffffffffffffff90;
  bVar2.ptr_ = in_stack_ffffffffffffff98;
  while( true ) {
    sVar1 = boost::basic_string_ref<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_ref<char,_std::char_traits<char>_> *)bVar2.len_,
                       in_stack_ffffffffffffff8f);
    if (sVar1 == 0xffffffffffffffff) break;
    bVar2 = boost::basic_string_ref<char,_std::char_traits<char>_>::substr
                      (unaff_retaddr,(size_type)pos,in_RDX);
    std::
    vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                 *)bVar2.len_,
                (value_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    boost::basic_string_ref<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_ref<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8,sVar1 + 1
              );
  }
  std::
  vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  ::push_back((vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
               *)0xffffffffffffffff,(value_type *)bVar2.ptr_);
  return in_RDI;
}

Assistant:

std::vector<boost::string_ref> str_split(boost::string_ref str,
                                         char const delimiter) {
  std::vector<boost::string_ref> splits;
  while (true) {
    auto const dpos = str.find_first_of(delimiter);
    if (dpos == boost::string_ref::npos) {
      break;
    }
    splits.push_back(str.substr(0, dpos));
    str.remove_prefix(dpos+1);
  }
  splits.push_back(str);
  return splits;
}